

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_interactor.cc
# Opt level: O2

int recvall(int s,char *buf,int n)

{
  ulong uVar1;
  ulong uVar2;
  char *__buf;
  
  uVar2 = 0;
  __buf = buf;
  while( true ) {
    uVar1 = recv(s,__buf,(long)n,0);
    if (((n <= (int)uVar2) || ((int)uVar1 < 1)) ||
       (uVar2 = (uVar1 & 0xffffffff) + (uVar2 & 0xffffffff), buf[uVar2 - 1] == '\n')) break;
    __buf = buf + uVar2;
  }
  return (int)uVar2;
}

Assistant:

int recvall(int s, char* buf, int n)
{
  int total = 0;
  int ret = recv(s, buf, n, 0);
  while (ret > 0 && total < n)
  {
    total += ret;
    if (buf[total - 1] == '\n')
      break;
    ret = recv(s, buf + total, n, 0);
  }
  return total;
}